

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleep.c
# Opt level: O2

void nn_sleep(int milliseconds)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  timespec ts;
  
  ts.tv_sec = (__time_t)(milliseconds / 1000);
  ts.tv_nsec = (__syscall_slong_t)((milliseconds % 1000) * 1000000);
  iVar1 = nanosleep((timespec *)&ts,(timespec *)0x0);
  __stream = _stderr;
  if (iVar1 == 0) {
    return;
  }
  puVar2 = (uint *)__errno_location();
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/utils/sleep.c"
          ,0x2f);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_sleep (int milliseconds)
{
    int rc;
    struct timespec ts;

    ts.tv_sec = milliseconds / 1000;
    ts.tv_nsec = milliseconds % 1000 * 1000000;
    rc = nanosleep (&ts, NULL);
    errno_assert (rc == 0);    
}